

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute-eval.cc
# Opt level: O1

bool tinyusdz::tydra::anon_unknown_1::ToTerminalAttributeValue
               (Attribute *attr,TerminalAttributeValue *value,string *err,double t,
               TimeSampleInterpolationType tinterp)

{
  PrimVar *this;
  vtable_type *pvVar1;
  uint32_t uVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  Value *v;
  bool bVar6;
  Value v_1;
  ostringstream ss_e;
  long *local_1e0;
  long local_1d0 [2];
  double local_1c0;
  storage_union local_1b8;
  undefined **local_1a8;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  if (value == (TerminalAttributeValue *)0x0) {
    return false;
  }
  local_1c0 = t;
  if ((attr->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (attr->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pvVar1 = (attr->_var)._value.v_.vtable;
    if (pvVar1 == (vtable_type *)0x0) {
      bVar6 = false;
    }
    else {
      uVar2 = (*pvVar1->type_id)();
      bVar6 = uVar2 == 4;
    }
    if ((bVar6) || (((attr->_var)._blocked & 1U) != 0)) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/attribute-eval.cc"
                 ,0x5e);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"ToTerminalAttributeValue",0x18);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(local_1a0,0x20);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      pcVar5 = "Attribute is None(Value Blocked).";
      lVar4 = 0x21;
      goto LAB_005167ec;
    }
  }
  this = &attr->_var;
  AttrMetas::operator=(&value->_meta,&attr->_metas);
  value->_variability = attr->_variability;
  bVar6 = primvar::PrimVar::is_valid(this);
  if (bVar6) {
    bVar6 = primvar::PrimVar::is_scalar(this);
    if (bVar6) {
      linb::any::operator=(&(value->_value).v_,(any *)this);
      value->_empty = false;
      return true;
    }
    bVar6 = primvar::PrimVar::is_timesamples(this);
    if (bVar6) {
      local_1a8 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
      local_1b8.dynamic = (void *)0x0;
      bVar6 = primvar::PrimVar::get_interpolated_value(this,local_1c0,tinterp,(Value *)&local_1b8);
      if (bVar6) {
        linb::any::operator=(&(value->_value).v_,(any *)&local_1b8);
        value->_empty = false;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_1a0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/attribute-eval.cc"
                   ,0x5e);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"ToTerminalAttributeValue",0x18);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
        poVar3 = (ostream *)::std::ostream::operator<<(local_1a0,0x38);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"Interpolate TimeSamples failed.",0x1f);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,(ulong)local_1e0);
          if (local_1e0 != local_1d0) {
            operator_delete(local_1e0,local_1d0[0] + 1);
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
        ::std::ios_base::~ios_base(local_130);
      }
      if (local_1a8 != (undefined **)0x0) {
        (*(code *)local_1a8[4])(&local_1b8);
      }
      if (!bVar6) {
        return false;
      }
      return true;
    }
    return true;
  }
  ::std::__cxx11::ostringstream::ostringstream(local_1a0);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[error]",7);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/attribute-eval.cc"
             ,0x5e);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"ToTerminalAttributeValue",0x18);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
  poVar3 = (ostream *)::std::ostream::operator<<(local_1a0,0x2e);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  pcVar5 = "[InternalError] Attribute is invalid.";
  lVar4 = 0x25;
LAB_005167ec:
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar5,lVar4);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
  if (err != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)err,(ulong)local_1e0);
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0,local_1d0[0] + 1);
    }
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
  ::std::ios_base::~ios_base(local_130);
  return false;
}

Assistant:

bool ToTerminalAttributeValue(
    const Attribute &attr, TerminalAttributeValue *value, std::string *err,
    const double t, const value::TimeSampleInterpolationType tinterp) {
  if (!value) {
    // ???
    return false;
  }

  if (attr.is_blocked()) {
    PUSH_ERROR_AND_RETURN("Attribute is None(Value Blocked).");
  }

  const primvar::PrimVar &var = attr.get_var();

  value->meta() = attr.metas();
  value->variability() = attr.variability();

  DCOUT("var has_default " << var.has_default());
  DCOUT("var has_timesamples " << var.has_default());
  DCOUT("var is_blocked " << var.is_blocked());
  DCOUT("var is_valid " << var.is_valid());

  if (!var.is_valid()) {
    PUSH_ERROR_AND_RETURN("[InternalError] Attribute is invalid.");
  } else if (var.is_scalar()) {
    const value::Value &v = var.value_raw();
    DCOUT("Attribute is scalar type:" << v.type_name());
    DCOUT("Attribute value = " << pprint_value(v));

    value->set_value(v);
  } else if (var.is_timesamples()) {
    value::Value v;
    if (!var.get_interpolated_value(t, tinterp, &v)) {
      PUSH_ERROR_AND_RETURN("Interpolate TimeSamples failed.");
      return false;
    }

    value->set_value(v);
  }

  return true;
}